

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O3

int __thiscall
tchecker::while_statement_t::clone
          (while_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  while_statement_t *this_00;
  shared_ptr<const_tchecker::statement_t> stmt_clone;
  shared_ptr<const_tchecker::expression_t> condition_clone;
  shared_ptr<const_tchecker::statement_t> local_30;
  shared_ptr<const_tchecker::expression_t> local_20;
  
  iVar1 = (*((this->_condition).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_expression_t[2])();
  local_20.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::expression_t*>
            (&local_20.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_20.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  iVar1 = (*((this->_stmt).
             super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_statement_t[2])();
  local_30.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(extraout_var_00,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::statement_t*>
            (&local_30.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_30.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  this_00 = (while_statement_t *)operator_new(0x28);
  while_statement_t(this_00,&local_20,&local_30);
  if (local_30.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return (int)this_00;
}

Assistant:

tchecker::while_statement_t * while_statement_t::clone() const
{
  std::shared_ptr<tchecker::expression_t const> condition_clone{_condition->clone()};
  std::shared_ptr<tchecker::statement_t const> stmt_clone{_stmt->clone()};
  return new tchecker::while_statement_t(condition_clone, stmt_clone);
}